

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo_parallel1.cpp
# Opt level: O0

int256_t *
anon_unknown.dwarf_cb25c::S2_thread<primesum::int256_t>
          (uint128_t x,int64_t y,int64_t c,int64_t segment_size,int64_t segments_per_thread,
          int64_t thread_num,int64_t low,int64_t limit,vector<int,_std::allocator<int>_> *pi,
          vector<int,_std::allocator<int>_> *primes,vector<int,_std::allocator<int>_> *lpf,
          vector<int,_std::allocator<int>_> *mu,
          vector<primesum::int256_t,_std::allocator<primesum::int256_t>_> *mu_sum,
          vector<primesum::int256_t,_std::allocator<primesum::int256_t>_> *phi)

{
  undefined1 a [16];
  undefined1 a_00 [16];
  undefined1 a_01 [16];
  undefined1 a_02 [16];
  undefined1 x_00 [16];
  vector<int,_std::allocator<int>_> *pvVar1;
  WheelItem *pWVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  long *plVar6;
  size_type sVar7;
  reference pvVar8;
  long lVar9;
  size_type in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  int256_t *in_RDI;
  long in_R8;
  long in_R9;
  undefined1 auVar10 [16];
  long in_stack_00000008;
  long in_stack_00000010;
  BitSieve *in_stack_00000018;
  long lStack0000000000000020;
  vector<int,_std::allocator<int>_> *in_stack_00000028;
  vector<int,_std::allocator<int>_> *in_stack_00000030;
  vector<int,_std::allocator<int>_> *in_stack_00000038;
  vector<int,_std::allocator<int>_> *in_stack_00000040;
  vector<primesum::int256_t,_std::allocator<primesum::int256_t>_> *in_stack_00000048;
  vector<primesum::int256_t,_std::allocator<primesum::int256_t>_> *in_stack_00000050;
  int64_t stop_1;
  int64_t xn_1;
  int64_t i_1;
  int64_t min_m_1;
  int64_t l;
  int64_t prime_1;
  int64_t stop;
  int64_t xn;
  int64_t m;
  int64_t i;
  int64_t max_m;
  int64_t min_m;
  int64_t prime;
  int64_t b;
  int64_t high;
  Wheel wheel;
  BitSieve sieve;
  int256_t S2_thread;
  int64_t pi_y;
  int64_t pi_sqrty;
  int64_t size;
  uint64_t in_stack_fffffffffffffb38;
  BitSieve *in_stack_fffffffffffffb40;
  long in_stack_fffffffffffffb48;
  WheelItem *in_stack_fffffffffffffb50;
  WheelItem *in_stack_fffffffffffffb58;
  value_type *in_stack_fffffffffffffb60;
  undefined7 in_stack_fffffffffffffb68;
  undefined1 in_stack_fffffffffffffb6f;
  reference in_stack_fffffffffffffb70;
  long in_stack_fffffffffffffb78;
  undefined7 in_stack_fffffffffffffb80;
  undefined1 in_stack_fffffffffffffb87;
  int64_t in_stack_fffffffffffffba8;
  int64_t in_stack_fffffffffffffbb0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffbb8;
  Wheel *in_stack_fffffffffffffbc0;
  BitSieve *in_stack_fffffffffffffc30;
  uint64_t in_stack_fffffffffffffc38;
  BitSieve *in_stack_fffffffffffffc40;
  int256_t local_348;
  int256_t local_328 [2];
  int256_t local_2e8;
  long local_2c0;
  long local_2b8;
  long local_2b0;
  unsigned___int128 *local_2a8;
  undefined1 local_298 [16];
  unsigned___int128 *local_280;
  undefined1 local_278 [16];
  size_type local_268;
  WheelItem *local_260;
  int256_t local_258;
  int256_t local_238 [2];
  int256_t local_1f8;
  long local_1d8;
  long local_1d0;
  size_type local_1c8;
  long local_1c0;
  undefined1 local_1b8 [16];
  uint64_t local_1a0;
  unsigned___int128 *local_198;
  undefined1 local_188 [16];
  unsigned___int128 *local_170;
  BitSieve *local_168;
  size_type local_160;
  long local_158;
  long local_150;
  int256_t local_148;
  int256_t local_128 [3];
  int256_t local_b8;
  long local_98;
  long local_90;
  unsigned___int128 *local_88;
  unsigned___int128 *local_78;
  undefined1 local_68 [16];
  long local_50;
  BitSieve *local_48;
  long local_40;
  long local_38;
  size_type local_30;
  undefined8 local_28;
  undefined8 local_20;
  
  in_stack_00000018 =
       (BitSieve *)((long)in_stack_00000018 + in_R9 * in_stack_00000008 * in_stack_00000010);
  local_48 = (BitSieve *)
             ((long)&(((vector<primesum::WheelItem,_std::allocator<primesum::WheelItem>_> *)
                      &in_stack_00000018->sieve_)->
                     super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>).
                     _M_impl.super__Vector_impl_data._M_start + in_R9 * in_stack_00000008);
  local_40 = in_R9;
  local_38 = in_R8;
  local_30 = in_RCX;
  local_28 = in_RSI;
  local_20 = in_RDX;
  plVar6 = std::min<long>((long *)&local_48,&stack0x00000020);
  pvVar1 = in_stack_00000028;
  lStack0000000000000020 = *plVar6;
  local_68 = __udivti3(local_28,local_20,in_stack_00000018,(long)in_stack_00000018 >> 0x3f);
  x_00._8_7_ = in_stack_fffffffffffffb68;
  x_00._0_8_ = in_stack_fffffffffffffb60;
  x_00[0xf] = in_stack_fffffffffffffb6f;
  local_88 = primesum::isqrt<unsigned__int128>((unsigned___int128)x_00);
  auVar10._8_8_ = in_stack_fffffffffffffb58;
  auVar10._0_8_ = in_stack_fffffffffffffb50;
  local_78 = local_88;
  sVar7 = primesum::min<unsigned__int128,long>((unsigned___int128)auVar10,in_stack_fffffffffffffb48)
  ;
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pvVar1,sVar7);
  pvVar1 = in_stack_00000028;
  local_50 = (long)(*pvVar8 + 1);
  sVar7 = primesum::isqrt<long>((long)in_stack_fffffffffffffb40);
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pvVar1,sVar7);
  local_90 = (long)*pvVar8;
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](in_stack_00000028,local_30);
  local_98 = (long)*pvVar8;
  primesum::int256_t::int256_t<int,void>(&local_b8,0);
  if (local_38 < local_50 + -1) {
    primesum::BitSieve::BitSieve
              ((BitSieve *)in_stack_fffffffffffffb70,
               CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68));
    primesum::Wheel::Wheel<std::vector<int,std::allocator<int>>>
              (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,
               in_stack_fffffffffffffba8);
    primesum::int256_t::int256_t<int,void>(local_128,0);
    std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>::resize
              ((vector<primesum::int256_t,_std::allocator<primesum::int256_t>_> *)
               in_stack_fffffffffffffb70,
               CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68),
               in_stack_fffffffffffffb60);
    primesum::int256_t::int256_t<int,void>(&local_148,0);
    std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>::resize
              ((vector<primesum::int256_t,_std::allocator<primesum::int256_t>_> *)
               in_stack_fffffffffffffb70,
               CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68),
               in_stack_fffffffffffffb60);
    for (; (long)in_stack_00000018 < lStack0000000000000020;
        in_stack_00000018 =
             (BitSieve *)
             ((long)&(((vector<primesum::WheelItem,_std::allocator<primesum::WheelItem>_> *)
                      &in_stack_00000018->sieve_)->
                     super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>).
                     _M_impl.super__Vector_impl_data._M_start + local_40)) {
      local_158 = (long)&(((vector<primesum::WheelItem,_std::allocator<primesum::WheelItem>_> *)
                          &in_stack_00000018->sieve_)->
                         super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>
                         )._M_impl.super__Vector_impl_data._M_start + local_40;
      plVar6 = std::min<long>(&local_158,&stack0x00000020);
      local_150 = *plVar6;
      local_160 = local_38 + 1;
      primesum::BitSieve::pre_sieve
                (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
                 (uint64_t)in_stack_fffffffffffffc30);
      while( true ) {
        sVar7 = local_160;
        plVar6 = std::min<long>(&local_90,&local_50);
        if (*plVar6 <= (long)sVar7) break;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](in_stack_00000030,local_160);
        in_stack_fffffffffffffc40 = (BitSieve *)(long)*pvVar8;
        local_168 = in_stack_fffffffffffffc40;
        auVar10 = __udivti3(local_28,local_20,(long)in_stack_fffffffffffffc40 * local_150,
                            (long)in_stack_fffffffffffffc40 * local_150 >> 0x3f);
        a._8_8_ = in_stack_fffffffffffffb58;
        a._0_8_ = in_stack_fffffffffffffb50;
        local_188 = auVar10;
        local_198 = primesum::max<unsigned__int128,long>
                              ((unsigned___int128)a,in_stack_fffffffffffffb48);
        local_170 = local_198;
        auVar10 = __udivti3(local_28,local_20,(long)local_168 * (long)in_stack_00000018,
                            (long)local_168 * (long)in_stack_00000018 >> 0x3f);
        a_00._8_8_ = in_stack_fffffffffffffb58;
        a_00._0_8_ = in_stack_fffffffffffffb50;
        local_1b8 = auVar10;
        in_stack_fffffffffffffc38 =
             primesum::min<unsigned__int128,long>((unsigned___int128)a_00,in_stack_fffffffffffffb48)
        ;
        local_1c0 = 0;
        sVar7 = in_stack_fffffffffffffc38;
        local_1a0 = in_stack_fffffffffffffc38;
        if ((long)in_stack_fffffffffffffc38 <= (long)local_168) goto LAB_001492ce;
        while (local_1c8 = sVar7, (long)local_170 < (long)local_1c8) {
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](in_stack_00000040,local_1c8);
          if (*pvVar8 != 0) {
            in_stack_fffffffffffffc30 = local_168;
            pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](in_stack_00000038,local_1c8)
            ;
            if ((long)in_stack_fffffffffffffc30 < (long)*pvVar8) {
              local_1d0 = __udivti3(local_28,local_20,(long)local_168 * local_1c8,
                                    (long)((long)local_168 * local_1c8) >> 0x3f);
              local_1d8 = local_1d0 - (long)in_stack_00000018;
              for (; local_1c0 <= local_1d8; local_1c0 = local_1c0 + 2) {
                lVar9 = (long)&(((vector<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>
                                  *)&in_stack_00000018->sieve_)->
                               super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>
                               )._M_impl.super__Vector_impl_data._M_start + local_1c0;
                bVar5 = primesum::BitSieve::operator[]
                                  (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
                primesum::int256_t::int256_t<long,void>(&local_1f8,lVar9 * (ulong)bVar5);
                std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>::operator[]
                          (in_stack_00000050,local_160);
                primesum::int256_t::operator+=
                          (in_stack_fffffffffffffb70,
                           (int256_t *)CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68)
                          );
              }
              std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>::operator[]
                        (in_stack_00000050,local_160);
              std::vector<int,_std::allocator<int>_>::operator[](in_stack_00000040,local_1c8);
              primesum::int256_t::operator*
                        ((int256_t *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                         in_stack_fffffffffffffb78);
              primesum::int256_t::operator-=
                        (in_stack_fffffffffffffb70,
                         (int256_t *)CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68));
              pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (in_stack_00000040,local_1c8);
              primesum::int256_t::int256_t<long,void>
                        (local_238,(long)*pvVar8 * local_1c8 * (long)local_168);
              std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>::operator[]
                        (in_stack_00000048,local_160);
              primesum::int256_t::operator-=
                        (in_stack_fffffffffffffb70,
                         (int256_t *)CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68));
            }
          }
          sVar7 = local_1c8 - 1;
        }
        for (; local_1c0 < local_150 - (long)in_stack_00000018; local_1c0 = local_1c0 + 2) {
          lVar9 = (long)&(((vector<primesum::WheelItem,_std::allocator<primesum::WheelItem>_> *)
                          &in_stack_00000018->sieve_)->
                         super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>
                         )._M_impl.super__Vector_impl_data._M_start + local_1c0;
          bVar5 = primesum::BitSieve::operator[]
                            (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
          primesum::int256_t::int256_t<long,void>(&local_258,lVar9 * (ulong)bVar5);
          std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>::operator[]
                    (in_stack_00000050,local_160);
          primesum::int256_t::operator+=
                    (in_stack_fffffffffffffb70,
                     (int256_t *)CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68));
        }
        primesum::Wheel::operator[]((Wheel *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
        cross_off((BitSieve *)in_stack_fffffffffffffb70,
                  CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68),
                  (int64_t)in_stack_fffffffffffffb60,(int64_t)in_stack_fffffffffffffb58,
                  in_stack_fffffffffffffb50);
        local_160 = local_160 + 1;
      }
      while( true ) {
        sVar7 = local_160;
        plVar6 = std::min<long>(&local_98,&local_50);
        if (*plVar6 <= (long)sVar7) break;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](in_stack_00000030,local_160);
        pvVar1 = in_stack_00000028;
        local_260 = (WheelItem *)(long)*pvVar8;
        auVar10 = __udivti3(local_28,local_20,(long)local_260 * (long)in_stack_00000018,
                            (long)local_260 * (long)in_stack_00000018 >> 0x3f);
        a_01._8_8_ = in_stack_fffffffffffffb58;
        a_01._0_8_ = in_stack_fffffffffffffb50;
        local_278 = auVar10;
        sVar7 = primesum::min<unsigned__int128,long>
                          ((unsigned___int128)a_01,in_stack_fffffffffffffb48);
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](pvVar1,sVar7);
        local_268 = (size_type)*pvVar8;
        auVar10 = __udivti3(local_28,local_20,(long)local_260 * local_150,
                            (long)local_260 * local_150 >> 0x3f);
        a_02._8_8_ = in_stack_fffffffffffffb58;
        a_02._0_8_ = in_stack_fffffffffffffb50;
        local_298 = auVar10;
        local_2a8 = primesum::max<unsigned__int128,long>
                              ((unsigned___int128)a_02,in_stack_fffffffffffffb48,
                               (long)in_stack_fffffffffffffb40);
        pWVar2 = local_260;
        local_2b0 = 0;
        local_280 = local_2a8;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](in_stack_00000030,local_268);
        if ((long)*pvVar8 <= (long)pWVar2) break;
        while( true ) {
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](in_stack_00000030,local_268);
          uVar4 = local_20;
          uVar3 = local_28;
          pWVar2 = local_260;
          if ((long)*pvVar8 <= (long)local_280) break;
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](in_stack_00000030,local_268);
          local_2b8 = __udivti3(uVar3,uVar4,(long)pWVar2 * (long)*pvVar8,
                                (long)pWVar2 * (long)*pvVar8 >> 0x3f);
          local_2c0 = local_2b8 - (long)in_stack_00000018;
          for (; local_2b0 <= local_2c0; local_2b0 = local_2b0 + 2) {
            in_stack_fffffffffffffb78 =
                 (long)&(((vector<primesum::WheelItem,_std::allocator<primesum::WheelItem>_> *)
                         &in_stack_00000018->sieve_)->
                        super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>
                        )._M_impl.super__Vector_impl_data._M_start + local_2b0;
            in_stack_fffffffffffffb87 =
                 primesum::BitSieve::operator[](in_stack_fffffffffffffb40,in_stack_fffffffffffffb38)
            ;
            primesum::int256_t::int256_t<long,void>
                      (&local_2e8,in_stack_fffffffffffffb78 * (ulong)(byte)in_stack_fffffffffffffb87
                      );
            std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>::operator[]
                      (in_stack_00000050,local_160);
            primesum::int256_t::operator+=
                      (in_stack_fffffffffffffb70,
                       (int256_t *)CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68));
          }
          in_stack_fffffffffffffb70 =
               std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>::operator[]
                         (in_stack_00000050,local_160);
          std::vector<int,_std::allocator<int>_>::operator[](in_stack_00000030,local_268);
          primesum::int256_t::operator*
                    ((int256_t *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80),
                     in_stack_fffffffffffffb78);
          primesum::int256_t::operator+=
                    (in_stack_fffffffffffffb70,
                     (int256_t *)CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68));
          pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](in_stack_00000030,local_268);
          primesum::int256_t::int256_t<long,void>(local_328,(long)*pvVar8 * (long)local_260);
          std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>::operator[]
                    (in_stack_00000048,local_160);
          primesum::int256_t::operator+=
                    (in_stack_fffffffffffffb70,
                     (int256_t *)CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68));
          local_268 = local_268 - 1;
        }
        for (; local_2b0 < local_150 - (long)in_stack_00000018; local_2b0 = local_2b0 + 2) {
          in_stack_fffffffffffffb60 =
               (value_type *)
               ((long)&(((vector<primesum::WheelItem,_std::allocator<primesum::WheelItem>_> *)
                        &in_stack_00000018->sieve_)->
                       super__Vector_base<primesum::WheelItem,_std::allocator<primesum::WheelItem>_>
                       )._M_impl.super__Vector_impl_data._M_start + local_2b0);
          in_stack_fffffffffffffb6f =
               primesum::BitSieve::operator[](in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
          primesum::int256_t::int256_t<long,void>
                    (&local_348,
                     (long)in_stack_fffffffffffffb60 * (ulong)(byte)in_stack_fffffffffffffb6f);
          std::vector<primesum::int256_t,_std::allocator<primesum::int256_t>_>::operator[]
                    (in_stack_00000050,local_160);
          primesum::int256_t::operator+=
                    (in_stack_fffffffffffffb70,
                     (int256_t *)CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68));
        }
        in_stack_fffffffffffffb40 = in_stack_00000018;
        in_stack_fffffffffffffb48 = local_150;
        in_stack_fffffffffffffb50 = local_260;
        in_stack_fffffffffffffb58 =
             primesum::Wheel::operator[]((Wheel *)in_stack_00000018,in_stack_fffffffffffffb38);
        cross_off((BitSieve *)in_stack_fffffffffffffb70,
                  CONCAT17(in_stack_fffffffffffffb6f,in_stack_fffffffffffffb68),
                  (int64_t)in_stack_fffffffffffffb60,(int64_t)in_stack_fffffffffffffb58,
                  in_stack_fffffffffffffb50);
        local_160 = local_160 + 1;
      }
LAB_001492ce:
    }
    *(undefined8 *)&in_RDI->low = (undefined8)local_b8.low;
    *(undefined8 *)((long)&in_RDI->low + 8) = local_b8.low._8_8_;
    *(undefined8 *)&in_RDI->high = (undefined8)local_b8.high;
    *(undefined8 *)((long)&in_RDI->high + 8) = local_b8.high._8_8_;
    primesum::Wheel::~Wheel((Wheel *)0x149331);
    primesum::BitSieve::~BitSieve((BitSieve *)0x14933e);
  }
  else {
    primesum::int256_t::int256_t<int,void>(in_RDI,0);
  }
  return in_RDI;
}

Assistant:

T S2_thread(uint128_t x,
            int64_t y,
            int64_t c,
            int64_t segment_size,
            int64_t segments_per_thread,
            int64_t thread_num,
            int64_t low,
            int64_t limit,
            vector<int32_t>& pi,
            vector<int32_t>& primes,
            vector<int32_t>& lpf,
            vector<int32_t>& mu,
            vector<T>& mu_sum,
            vector<T>& phi)
{
  low += segment_size * segments_per_thread * thread_num;
  limit = min(low + segment_size * segments_per_thread, limit);
  int64_t size = pi[min(isqrt(x / low), y)] + 1;
  int64_t pi_sqrty = pi[isqrt(y)];
  int64_t pi_y = pi[y];
  T S2_thread = 0;

  if (c >= size - 1)
    return 0;

  BitSieve sieve(segment_size);
  Wheel wheel(primes, size, low);
  phi.resize(size, 0);
  mu_sum.resize(size, 0);

  // Process the segments assigned to the current thread
  for (; low < limit; low += segment_size)
  {
    // Current segment = interval [low, high[
    int64_t high = min(low + segment_size, limit);
    int64_t b = c + 1;

    // pre-sieve the multiples of the first c primes
    sieve.pre_sieve(c, low);

    // For c + 1 <= b < pi_sqrty
    // Find all special leaves: n = primes[b] * m
    // which satisfy:  mu[m] != 0 && primes[b] < lpf[m], low <= (x / n) < high
    for (; b < min(pi_sqrty, size); b++)
    {
      int64_t prime = primes[b];
      int64_t min_m = max(x / (prime * high), y / prime);
      int64_t max_m = min(x / (prime * low), y);
      int64_t i = 0;

      if (prime >= max_m)
        goto next_segment;

      for (int64_t m = max_m; m > min_m; m--)
      {
        if (mu[m] != 0 && prime < lpf[m])
        {
          int64_t xn = x / (prime * m);
          int64_t stop = xn - low;
          for (; i <= stop; i += 2)
            phi[b] += (low + i) * sieve[i];
          S2_thread -= phi[b] * (mu[m] * m * prime);
          mu_sum[b] -= mu[m] * m * prime;
        }
      }

      for (; i < high - low; i += 2)
        phi[b] += (low + i) * sieve[i];

      cross_off(sieve, low, high, prime, wheel[b]);
    }

    // For pi_sqrty <= b < pi_y
    // Find all special leaves: n = primes[b] * prime2
    // which satisfy: low <= (x / n) < high
    for (; b < min(pi_y, size); b++)
    {
      int64_t prime = primes[b];
      int64_t l = pi[min(x / (prime * low), y)];
      int64_t min_m = max(x / (prime * high), y / prime, prime);
      int64_t i = 0;

      if (prime >= primes[l])
        goto next_segment;

      for (; primes[l] > min_m; l--)
      {
        int64_t xn = x / (prime * primes[l]);
        int64_t stop = xn - low;
        for (; i <= stop; i += 2)
          phi[b] += (low + i) * sieve[i];
        S2_thread += phi[b] * (primes[l] * prime);
        mu_sum[b] += primes[l] * prime;
      }

      for (; i < high - low; i += 2)
        phi[b] += (low + i) * sieve[i];

      cross_off(sieve, low, high, prime, wheel[b]);
    }

    next_segment:;
  }

  return S2_thread;
}